

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cecSolve.c
# Opt level: O3

Abc_Cex_t * Cex_ManGenSimple(Cec_ManSat_t *p,int iOut)

{
  Abc_Cex_t *pAVar1;
  
  pAVar1 = Abc_CexAlloc(0,p->pAig->vCis->nSize,1);
  pAVar1->iPo = iOut;
  pAVar1->iFrame = 0;
  return pAVar1;
}

Assistant:

Abc_Cex_t * Cex_ManGenSimple( Cec_ManSat_t * p, int iOut )
{
    Abc_Cex_t * pCex;
    pCex = Abc_CexAlloc( 0, Gia_ManCiNum(p->pAig), 1 );
    pCex->iPo = iOut;
    pCex->iFrame = 0;
    return pCex;
}